

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testobject.cpp
# Opt level: O3

void test_web_init(Am_Slot *slot,Am_Web_Init *init)

{
  int iVar1;
  int iVar2;
  Am_Value *pAVar3;
  Am_Object_Advanced obj;
  Am_Object local_40;
  Am_Object local_38;
  Am_Object local_30;
  Am_Object local_28;
  Am_Object local_20;
  
  Am_Slot::Get_Owner();
  pAVar3 = (Am_Value *)Am_Slot::Get();
  iVar1 = Am_Value::operator_cast_to_int(pAVar3);
  pAVar3 = (Am_Value *)Am_Object::Get((ushort)&local_40,0x274c);
  iVar2 = Am_Value::operator_cast_to_int(pAVar3);
  Am_Object::Set((ushort)&local_40,0x272e,(ulong)(uint)(iVar2 + iVar1));
  Am_Object::Am_Object(&local_20,&local_40);
  Am_Web_Init::Note_Output((Am_Object_Advanced)init,(ushort)&local_20);
  Am_Object::~Am_Object(&local_20);
  Am_Object::Am_Object(&local_28,&local_40);
  Am_Web_Init::Note_Input((Am_Object_Advanced)init,(ushort)&local_28);
  Am_Object::~Am_Object(&local_28);
  Am_Object::Am_Object(&local_30,&local_40);
  Am_Web_Init::Note_Input((Am_Object_Advanced)init,(ushort)&local_30);
  Am_Object::~Am_Object(&local_30);
  Am_Object::Am_Object(&local_38,&local_40);
  Am_Web_Init::Note_Input((Am_Object_Advanced)init,(ushort)&local_38);
  Am_Object::~Am_Object(&local_38);
  Am_Object::~Am_Object(&local_40);
  return;
}

Assistant:

void
test_web_init(const Am_Slot &slot, Am_Web_Init &init)
{
  Am_Object_Advanced obj = slot.Get_Owner();
  int value = slot.Get();
  int size = obj.Get(SHADOW);
  obj.Set(WIDTH, value + size);
  init.Note_Output(obj, WIDTH);
  init.Note_Input(obj, LEFT);
  init.Note_Input(obj, WIDTH);
  init.Note_Input(obj, SHADOW);
}